

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * tga_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint8 uVar5;
  byte bVar6;
  uint8 uVar7;
  int n;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int local_a4;
  int iStack_a0;
  uchar temp;
  int index2;
  int index1;
  int pal_idx;
  int RLE_cmd;
  int read_next_pixel;
  int RLE_repeating;
  int RLE_count;
  uchar trans_data [4];
  uchar raw_data [4];
  int j;
  int i;
  uchar *tga_palette;
  uchar *tga_data;
  int tga_inverted;
  int tga_bits_per_pixel;
  int tga_height;
  int tga_width;
  int tga_y_origin;
  int tga_x_origin;
  int tga_palette_bits;
  int tga_palette_len;
  int tga_palette_start;
  int tga_is_RLE;
  int tga_image_type;
  int tga_indexed;
  int tga_offset;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi *s_local;
  
  bVar4 = get8u(s);
  uVar5 = get8u(s);
  bVar6 = get8u(s);
  tga_palette_start = (int)bVar6;
  n = get16le(s);
  iVar8 = get16le(s);
  bVar6 = get8u(s);
  uVar9 = (uint)bVar6;
  get16le(s);
  get16le(s);
  iVar10 = get16le(s);
  iVar11 = get16le(s);
  bVar6 = get8u(s);
  tga_data._4_4_ = (uint)bVar6;
  bVar6 = get8u(s);
  _j = (stbi_uc *)0x0;
  memset(&RLE_repeating,0,4);
  read_next_pixel = 0;
  RLE_cmd = 0;
  bVar3 = true;
  bVar2 = 7 < (uint)tga_palette_start;
  if (bVar2) {
    tga_palette_start = tga_palette_start - 8;
  }
  if (((((iVar10 < 1) || (iVar11 < 1)) || (tga_palette_start < 1)) || (3 < tga_palette_start)) ||
     (((tga_data._4_4_ != 8 && (tga_data._4_4_ != 0x10)) &&
      ((tga_data._4_4_ != 0x18 && (tga_data._4_4_ != 0x20)))))) {
    s_local = (stbi *)0x0;
  }
  else {
    if (uVar5 != '\0') {
      tga_data._4_4_ = uVar9;
    }
    *x = iVar10;
    *y = iVar11;
    if ((req_comp < 1) || (4 < req_comp)) {
      tga_indexed = tga_data._4_4_ / 8;
      *comp = tga_indexed;
    }
    else {
      *comp = tga_data._4_4_ / 8;
      tga_indexed = req_comp;
    }
    s_local = (stbi *)malloc((long)(iVar10 * iVar11 * tga_indexed));
    skip(s,(uint)bVar4);
    if (uVar5 != '\0') {
      skip(s,n);
      _j = (stbi_uc *)malloc((long)((int)(iVar8 * uVar9) / 8));
      getn(s,_j,(int)(iVar8 * uVar9) / 8);
    }
    raw_data[0] = '\0';
    raw_data[1] = '\0';
    raw_data[2] = '\0';
    raw_data[3] = '\0';
    for (; (int)raw_data < iVar10 * iVar11; raw_data = (uchar  [4])((int)raw_data + 1)) {
      if (bVar2) {
        if (read_next_pixel == 0) {
          bVar4 = get8u(s);
          read_next_pixel = (bVar4 & 0x7f) + 1;
          RLE_cmd = (int)(uint)bVar4 >> 7;
          bVar3 = true;
        }
        else if (RLE_cmd == 0) {
          bVar3 = true;
        }
      }
      else {
        bVar3 = true;
      }
      if (bVar3) {
        if (uVar5 == '\0') {
          trans_data[0] = '\0';
          trans_data[1] = '\0';
          trans_data[2] = '\0';
          trans_data[3] = '\0';
          for (; (int)trans_data * 8 < (int)tga_data._4_4_;
              trans_data = (uchar  [4])((int)trans_data + 1)) {
            uVar7 = get8u(s);
            trans_data[(long)(int)trans_data + -4] = uVar7;
          }
        }
        else {
          bVar4 = get8u(s);
          index2 = (int)bVar4;
          if (iVar8 <= index2) {
            index2 = 0;
          }
          trans_data[0] = '\0';
          trans_data[1] = '\0';
          trans_data[2] = '\0';
          trans_data[3] = '\0';
          for (; (int)trans_data * 8 < (int)tga_data._4_4_;
              trans_data = (uchar  [4])((int)trans_data + 1)) {
            trans_data[(long)(int)trans_data + -4] =
                 _j[(int)((tga_data._4_4_ / 8) * index2 + (int)trans_data)];
          }
        }
        switch(tga_data._4_4_) {
        case 8:
          RLE_repeating._0_1_ = (byte)RLE_count;
          RLE_repeating._1_1_ = (byte)RLE_count;
          RLE_repeating._2_1_ = (byte)RLE_count;
          RLE_repeating._3_1_ = 0xff;
          break;
        case 0x10:
          RLE_repeating._0_1_ = (byte)RLE_count;
          RLE_repeating._1_1_ = (byte)RLE_count;
          RLE_repeating._2_1_ = (byte)RLE_count;
          RLE_repeating._3_1_ = RLE_count._1_1_;
          break;
        case 0x18:
          RLE_repeating._0_1_ = RLE_count._2_1_;
          RLE_repeating._1_1_ = RLE_count._1_1_;
          RLE_repeating._2_1_ = (byte)RLE_count;
          RLE_repeating._3_1_ = 0xff;
          break;
        case 0x20:
          RLE_repeating._0_1_ = RLE_count._2_1_;
          RLE_repeating._1_1_ = RLE_count._1_1_;
          RLE_repeating._2_1_ = (byte)RLE_count;
          RLE_repeating._3_1_ = RLE_count._3_1_;
        }
        bVar3 = false;
      }
      switch(tga_indexed) {
      case 1:
        uVar7 = compute_y((uint)(byte)RLE_repeating,(uint)RLE_repeating._1_1_,
                          (uint)RLE_repeating._2_1_);
        *(uint8 *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed)) = uVar7;
        break;
      case 2:
        uVar7 = compute_y((uint)(byte)RLE_repeating,(uint)RLE_repeating._1_1_,
                          (uint)RLE_repeating._2_1_);
        *(uint8 *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed)) = uVar7;
        *(byte *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed + 1)) =
             RLE_repeating._3_1_;
        break;
      case 3:
        *(byte *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed)) = (byte)RLE_repeating
        ;
        *(byte *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed + 1)) =
             RLE_repeating._1_1_;
        *(byte *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed + 2)) =
             RLE_repeating._2_1_;
        break;
      case 4:
        *(byte *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed)) = (byte)RLE_repeating
        ;
        *(byte *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed + 1)) =
             RLE_repeating._1_1_;
        *(byte *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed + 2)) =
             RLE_repeating._2_1_;
        *(byte *)((long)&s_local->img_x + (long)((int)raw_data * tga_indexed + 3)) =
             RLE_repeating._3_1_;
      }
      read_next_pixel = read_next_pixel + -1;
    }
    if (((int)(uint)bVar6 >> 5 & 1U) != 1) {
      trans_data[0] = '\0';
      trans_data[1] = '\0';
      trans_data[2] = '\0';
      trans_data[3] = '\0';
      for (; (int)trans_data * 2 < iVar11; trans_data = (uchar  [4])((int)trans_data + 1)) {
        iStack_a0 = (int)trans_data * iVar10 * tga_indexed;
        local_a4 = ((iVar11 + -1) - (int)trans_data) * iVar10 * tga_indexed;
        for (raw_data = (uchar  [4])(iVar10 * tga_indexed); 0 < (int)raw_data;
            raw_data = (uchar  [4])((int)raw_data + -1)) {
          uVar1 = *(undefined1 *)((long)&s_local->img_x + (long)iStack_a0);
          *(undefined1 *)((long)&s_local->img_x + (long)iStack_a0) =
               *(undefined1 *)((long)&s_local->img_x + (long)local_a4);
          *(undefined1 *)((long)&s_local->img_x + (long)local_a4) = uVar1;
          iStack_a0 = iStack_a0 + 1;
          local_a4 = local_a4 + 1;
        }
      }
    }
    if (_j != (stbi_uc *)0x0) {
      free(_j);
    }
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *tga_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	//	read in the TGA header stuff
	int tga_offset = get8u(s);
	int tga_indexed = get8u(s);
	int tga_image_type = get8u(s);
	int tga_is_RLE = 0;
	int tga_palette_start = get16le(s);
	int tga_palette_len = get16le(s);
	int tga_palette_bits = get8u(s);
	int tga_x_origin = get16le(s);
	int tga_y_origin = get16le(s);
	int tga_width = get16le(s);
	int tga_height = get16le(s);
	int tga_bits_per_pixel = get8u(s);
	int tga_inverted = get8u(s);
	//	image data
	unsigned char *tga_data;
	unsigned char *tga_palette = NULL;
	int i, j;
	unsigned char raw_data[4];
	unsigned char trans_data[] = { 0,0,0,0 };
	int RLE_count = 0;
	int RLE_repeating = 0;
	int read_next_pixel = 1;
	//	do a tiny bit of precessing
	if( tga_image_type >= 8 )
	{
		tga_image_type -= 8;
		tga_is_RLE = 1;
	}
	/* int tga_alpha_bits = tga_inverted & 15; */
	tga_inverted = 1 - ((tga_inverted >> 5) & 1);

	//	error check
	if( //(tga_indexed) ||
		(tga_width < 1) || (tga_height < 1) ||
		(tga_image_type < 1) || (tga_image_type > 3) ||
		((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16) &&
		(tga_bits_per_pixel != 24) && (tga_bits_per_pixel != 32))
		)
	{
		return NULL;
	}

	//	If I'm paletted, then I'll use the number of bits from the palette
	if( tga_indexed )
	{
		tga_bits_per_pixel = tga_palette_bits;
	}

	//	tga info
	*x = tga_width;
	*y = tga_height;
	if( (req_comp < 1) || (req_comp > 4) )
	{
		//	just use whatever the file was
		req_comp = tga_bits_per_pixel / 8;
		*comp = req_comp;
	} else
	{
		//	force a new number of components
		*comp = tga_bits_per_pixel/8;
	}
	tga_data = (unsigned char*)malloc( tga_width * tga_height * req_comp );

	//	skip to the data's starting position (offset usually = 0)
	skip(s, tga_offset );
	//	do I need to load a palette?
	if( tga_indexed )
	{
		//	any data to skip? (offset usually = 0)
		skip(s, tga_palette_start );
		//	load the palette
		tga_palette = (unsigned char*)malloc( tga_palette_len * tga_palette_bits / 8 );
		getn(s, tga_palette, tga_palette_len * tga_palette_bits / 8 );
	}
	//	load the data
	for( i = 0; i < tga_width * tga_height; ++i )
	{
		//	if I'm in RLE mode, do I need to get a RLE chunk?
		if( tga_is_RLE )
		{
			if( RLE_count == 0 )
			{
				//	yep, get the next byte as a RLE command
				int RLE_cmd = get8u(s);
				RLE_count = 1 + (RLE_cmd & 127);
				RLE_repeating = RLE_cmd >> 7;
				read_next_pixel = 1;
			} else if( !RLE_repeating )
			{
				read_next_pixel = 1;
			}
		} else
		{
			read_next_pixel = 1;
		}
		//	OK, if I need to read a pixel, do it now
		if( read_next_pixel )
		{
			//	load however much data we did have
			if( tga_indexed )
			{
				//	read in 1 byte, then perform the lookup
				int pal_idx = get8u(s);
				if( pal_idx >= tga_palette_len )
				{
					//	invalid index
					pal_idx = 0;
				}
				pal_idx *= tga_bits_per_pixel / 8;
				for( j = 0; j*8 < tga_bits_per_pixel; ++j )
				{
					raw_data[j] = tga_palette[pal_idx+j];
				}
			} else
			{
				//	read in the data raw
				for( j = 0; j*8 < tga_bits_per_pixel; ++j )
				{
					raw_data[j] = get8u(s);
				}
			}
			//	convert raw to the intermediate format
			switch( tga_bits_per_pixel )
			{
			case 8:
				//	Luminous => RGBA
				trans_data[0] = raw_data[0];
				trans_data[1] = raw_data[0];
				trans_data[2] = raw_data[0];
				trans_data[3] = 255;
				break;
			case 16:
				//	Luminous,Alpha => RGBA
				trans_data[0] = raw_data[0];
				trans_data[1] = raw_data[0];
				trans_data[2] = raw_data[0];
				trans_data[3] = raw_data[1];
				break;
			case 24:
				//	BGR => RGBA
				trans_data[0] = raw_data[2];
				trans_data[1] = raw_data[1];
				trans_data[2] = raw_data[0];
				trans_data[3] = 255;
				break;
			case 32:
				//	BGRA => RGBA
				trans_data[0] = raw_data[2];
				trans_data[1] = raw_data[1];
				trans_data[2] = raw_data[0];
				trans_data[3] = raw_data[3];
				break;
			}
			//	clear the reading flag for the next pixel
			read_next_pixel = 0;
		} // end of reading a pixel
		//	convert to final format
		switch( req_comp )
		{
		case 1:
			//	RGBA => Luminance
			tga_data[i*req_comp+0] = compute_y(trans_data[0],trans_data[1],trans_data[2]);
			break;
		case 2:
			//	RGBA => Luminance,Alpha
			tga_data[i*req_comp+0] = compute_y(trans_data[0],trans_data[1],trans_data[2]);
			tga_data[i*req_comp+1] = trans_data[3];
			break;
		case 3:
			//	RGBA => RGB
			tga_data[i*req_comp+0] = trans_data[0];
			tga_data[i*req_comp+1] = trans_data[1];
			tga_data[i*req_comp+2] = trans_data[2];
			break;
		case 4:
			//	RGBA => RGBA
			tga_data[i*req_comp+0] = trans_data[0];
			tga_data[i*req_comp+1] = trans_data[1];
			tga_data[i*req_comp+2] = trans_data[2];
			tga_data[i*req_comp+3] = trans_data[3];
			break;
		}
		//	in case we're in RLE mode, keep counting down
		--RLE_count;
	}
	//	do I need to invert the image?
	if( tga_inverted )
	{
		for( j = 0; j*2 < tga_height; ++j )
		{
			int index1 = j * tga_width * req_comp;
			int index2 = (tga_height - 1 - j) * tga_width * req_comp;
			for( i = tga_width * req_comp; i > 0; --i )
			{
				unsigned char temp = tga_data[index1];
				tga_data[index1] = tga_data[index2];
				tga_data[index2] = temp;
				++index1;
				++index2;
			}
		}
	}
	//	clear my palette, if I had one
	if( tga_palette != NULL )
	{
		free( tga_palette );
	}
	//	the things I do to get rid of an error message, and yet keep
	//	Microsoft's C compilers happy... [8^(
	tga_palette_start = tga_palette_len = tga_palette_bits =
			tga_x_origin = tga_y_origin = 0;
	//	OK, done
	return tga_data;
}